

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::Equals,false,false,true,true>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  int iVar1;
  int iVar2;
  int iVar3;
  unsigned_long *puVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  sel_t *psVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  sel_t sVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  idx_t iVar20;
  ulong uVar21;
  long lVar22;
  bool bVar23;
  
  if (count + 0x3f < 0x40) {
    iVar20 = 0;
  }
  else {
    puVar4 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar20 = 0;
    lVar10 = 0;
    uVar19 = 0;
    uVar13 = 0;
    do {
      uVar17 = uVar19;
      if (puVar4 == (unsigned_long *)0x0) {
        uVar21 = uVar19 + 0x40;
        if (count <= uVar19 + 0x40) {
          uVar21 = count;
        }
LAB_0145caa0:
        if (uVar19 < uVar21) {
          psVar5 = sel->sel_vector;
          psVar6 = true_sel->sel_vector;
          psVar7 = false_sel->sel_vector;
          uVar11 = uVar19 << 4 | 8;
          do {
            uVar17 = uVar19;
            if (psVar5 != (sel_t *)0x0) {
              uVar17 = (ulong)psVar5[uVar19];
            }
            iVar1 = *(int *)((long)ldata + (uVar11 - 8));
            iVar2 = *(int *)((long)rdata + (uVar11 - 8));
            iVar3 = *(int *)((long)ldata + (uVar11 - 4));
            iVar14 = *(int *)((long)rdata + (uVar11 - 4));
            lVar8 = *(long *)((long)&ldata->months + uVar11);
            lVar9 = *(long *)((long)&rdata->months + uVar11);
            if ((iVar14 != iVar3 || iVar2 != iVar1) ||
               (iVar14 = iVar3, bVar23 = true, lVar8 != lVar9)) {
              lVar22 = (long)iVar3 + lVar8 / 86400000000;
              lVar15 = (long)iVar14 + lVar9 / 86400000000;
              bVar23 = false;
              if (((long)iVar1 + lVar22 / 0x1e == (long)iVar2 + lVar15 / 0x1e) &&
                 (bVar23 = false, lVar22 % 0x1e == lVar15 % 0x1e)) {
                bVar23 = lVar8 % 86400000000 == lVar9 % 86400000000;
              }
            }
            psVar6[iVar20] = (sel_t)uVar17;
            iVar20 = iVar20 + bVar23;
            psVar7[lVar10] = (sel_t)uVar17;
            lVar10 = (ulong)(bVar23 ^ 1) + lVar10;
            uVar19 = uVar19 + 1;
            uVar11 = uVar11 + 0x10;
            uVar17 = uVar21;
          } while (uVar21 != uVar19);
        }
      }
      else {
        uVar11 = puVar4[uVar13];
        uVar21 = uVar19 + 0x40;
        if (count <= uVar19 + 0x40) {
          uVar21 = count;
        }
        if (uVar11 == 0xffffffffffffffff) goto LAB_0145caa0;
        if (uVar11 == 0) {
          uVar17 = uVar21;
          if (uVar19 < uVar21) {
            psVar5 = sel->sel_vector;
            psVar6 = false_sel->sel_vector;
            do {
              sVar16 = (sel_t)uVar19;
              if (psVar5 != (sel_t *)0x0) {
                sVar16 = psVar5[uVar19];
              }
              psVar6[lVar10] = sVar16;
              lVar10 = lVar10 + 1;
              uVar19 = uVar19 + 1;
            } while (uVar21 != uVar19);
          }
        }
        else if (uVar19 < uVar21) {
          psVar5 = sel->sel_vector;
          psVar6 = true_sel->sel_vector;
          psVar7 = false_sel->sel_vector;
          uVar12 = uVar19 << 4 | 8;
          uVar18 = 0;
          do {
            if (psVar5 == (sel_t *)0x0) {
              sVar16 = (int)uVar19 + (int)uVar18;
            }
            else {
              sVar16 = psVar5[uVar19 + uVar18];
            }
            if ((uVar11 >> (uVar18 & 0x3f) & 1) == 0) {
              bVar23 = false;
            }
            else {
              iVar1 = *(int *)((long)ldata + (uVar12 - 8));
              iVar2 = *(int *)((long)rdata + (uVar12 - 8));
              iVar3 = *(int *)((long)ldata + (uVar12 - 4));
              iVar14 = *(int *)((long)rdata + (uVar12 - 4));
              lVar8 = *(long *)((long)&ldata->months + uVar12);
              lVar9 = *(long *)((long)&rdata->months + uVar12);
              if ((iVar14 != iVar3 || iVar2 != iVar1) ||
                 (iVar14 = iVar3, bVar23 = true, lVar8 != lVar9)) {
                lVar22 = (long)iVar3 + lVar8 / 86400000000;
                lVar15 = (long)iVar14 + lVar9 / 86400000000;
                bVar23 = false;
                if (((long)iVar1 + lVar22 / 0x1e == (long)iVar2 + lVar15 / 0x1e) &&
                   (bVar23 = false, lVar22 % 0x1e == lVar15 % 0x1e)) {
                  bVar23 = lVar8 % 86400000000 == lVar9 % 86400000000;
                }
              }
            }
            psVar6[iVar20] = sVar16;
            iVar20 = iVar20 + bVar23;
            psVar7[lVar10] = sVar16;
            lVar10 = (ulong)(bVar23 ^ 1) + lVar10;
            uVar18 = uVar18 + 1;
            uVar12 = uVar12 + 0x10;
            uVar17 = uVar21;
          } while (uVar21 - uVar19 != uVar18);
        }
      }
      uVar19 = uVar17;
      uVar13 = uVar13 + 1;
    } while (uVar13 != count + 0x3f >> 6);
  }
  return iVar20;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}